

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

void __thiscall Parser::parse_rules_word(Parser *this)

{
  int iVar1;
  Parser *pPVar2;
  pointer pbVar3;
  bool bVar4;
  iterator iVar5;
  iterator iVar6;
  long *plVar7;
  _Rb_tree_color _Var8;
  string *s1;
  long lVar9;
  pointer s1_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  ci_equal comp_equal;
  string parsed_word;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  reserved_words;
  ci_equal local_532;
  allocator_type local_531;
  string local_530;
  Parser *local_510;
  long *local_508;
  long local_500;
  long local_4f8 [2];
  long *local_4e8;
  long local_4e0;
  long local_4d8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4c8;
  string local_4b0;
  key_type local_490;
  key_type local_470;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParsedGame::RulesTokenType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParsedGame::RulesTokenType>_>,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParsedGame::RulesTokenType>_>_>
  local_450;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>_>,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>_>_>
  local_420;
  undefined1 local_3f0 [8];
  _Alloc_hider local_3e8;
  char local_3e0 [8];
  undefined1 local_3d8 [16];
  int local_3c8;
  undefined1 local_3c0 [16];
  undefined1 *local_3b0 [2];
  undefined1 local_3a0 [16];
  undefined1 *local_390 [2];
  undefined1 local_380 [16];
  undefined1 *local_370 [2];
  undefined1 local_360 [16];
  undefined1 *local_350 [2];
  undefined1 local_340 [16];
  undefined1 *local_330 [2];
  undefined1 local_320 [16];
  undefined1 *local_310 [2];
  undefined1 local_300 [16];
  undefined1 *local_2f0 [2];
  undefined1 local_2e0 [16];
  undefined1 *local_2d0 [2];
  undefined1 local_2c0 [16];
  undefined1 *local_2b0 [2];
  undefined1 local_2a0 [16];
  undefined1 *local_290 [2];
  undefined1 local_280 [16];
  undefined1 *local_270 [2];
  undefined1 local_260 [16];
  undefined1 *local_250 [2];
  undefined1 local_240 [16];
  undefined1 *local_230 [2];
  undefined1 local_220 [16];
  undefined1 *local_210 [2];
  undefined1 local_200 [16];
  undefined1 *local_1f0 [2];
  undefined1 local_1e0 [16];
  undefined1 *local_1d0 [2];
  undefined1 local_1c0 [16];
  undefined1 *local_1b0 [2];
  undefined1 local_1a0 [16];
  undefined1 *local_190 [2];
  undefined1 local_180 [16];
  undefined1 *local_170 [2];
  undefined1 local_160 [16];
  undefined1 *local_150 [2];
  undefined1 local_140 [16];
  undefined1 *local_130 [2];
  undefined1 local_120 [16];
  undefined1 *local_110 [2];
  undefined1 local_100 [16];
  undefined1 *local_f0 [2];
  undefined1 local_e0 [16];
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *local_50 [2];
  long local_40 [2];
  
  parse_word_abi_cxx11_(&local_530,this);
  local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_470,local_530._M_dataplus._M_p,
             local_530._M_dataplus._M_p + local_530._M_string_length);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>_>,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>_>_>
  ::_Rb_tree(&local_420,&to_file_section_abi_cxx11_._M_t);
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>_>,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>_>_>
          ::find(&local_420,&local_470);
  if ((_Rb_tree_header *)iVar5._M_node == &local_420._M_impl.super__Rb_tree_header) {
    _Var8 = _S_red;
  }
  else {
    _Var8 = iVar5._M_node[2]._M_color;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>_>,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_FileSection>_>_>
  ::~_Rb_tree(&local_420);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
  if (_Var8 != _S_red) {
    try_change_file_section(this,_Var8);
    goto LAB_001477de;
  }
  local_3f0 = (undefined1  [8])local_3e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f0,"NO","");
  local_3d8._8_8_ = local_3c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)(local_3d8 + 8),"LATE","");
  local_3b0[0] = local_3a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"AGAIN","");
  local_390[0] = local_380;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_390,"MOVING","");
  local_370[0] = local_360;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_370,"STATIONARY","");
  local_350[0] = local_340;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_350,"PARALLEL","");
  local_330[0] = local_320;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"PERPENDICULAR","");
  local_310[0] = local_300;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_310,"HORIZONTAL","");
  local_2f0[0] = local_2e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"VERTICAL","");
  local_2d0[0] = local_2c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d0,"ORTHOGONAL","");
  local_2b0[0] = local_2a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"ACTION","");
  local_290[0] = local_280;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"UP","");
  local_270[0] = local_260;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"DOWN","");
  local_250[0] = local_240;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"LEFT","");
  local_230[0] = local_220;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"RIGHT","");
  local_210[0] = local_200;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"CHECKPOINT","");
  local_1f0[0] = local_1e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1f0,"CANCEL","");
  local_1d0[0] = local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"WIN","");
  local_1b0[0] = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"MESSAGE","");
  local_190[0] = local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"SFX0","");
  local_170[0] = local_160;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_170,"SFX1","");
  local_150[0] = local_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"SFX2","");
  local_130[0] = local_120;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_130,"SFX3","");
  local_110[0] = local_100;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"SFX4","");
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"SFX5","");
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"SFX6","");
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"SFX7","");
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"SFX8","");
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"SFX9","");
  plVar7 = local_40;
  local_50[0] = plVar7;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"SFX10","");
  __l._M_len = 0x1e;
  __l._M_array = (iterator)local_3f0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_4c8,__l,&local_531);
  lVar9 = -0x3c0;
  do {
    if (plVar7 != (long *)plVar7[-2]) {
      operator_delete((long *)plVar7[-2],*plVar7 + 1);
    }
    pbVar3 = local_4c8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    plVar7 = plVar7 + -4;
    lVar9 = lVar9 + 0x20;
  } while (lVar9 != 0);
  lVar9 = (long)local_4c8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_4c8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 7;
  s1_00 = local_4c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  local_510 = this;
  if (0 < lVar9) {
    lVar9 = lVar9 + 1;
    do {
      bVar4 = ci_equal::operator()(&local_532,s1_00,&local_530);
      s1 = s1_00;
      if (bVar4) goto LAB_0014759e;
      bVar4 = ci_equal::operator()(&local_532,s1_00 + 1,&local_530);
      s1 = s1_00 + 1;
      if (bVar4) goto LAB_0014759e;
      bVar4 = ci_equal::operator()(&local_532,s1_00 + 2,&local_530);
      s1 = s1_00 + 2;
      if (bVar4) goto LAB_0014759e;
      bVar4 = ci_equal::operator()(&local_532,s1_00 + 3,&local_530);
      s1 = s1_00 + 3;
      if (bVar4) goto LAB_0014759e;
      s1_00 = s1_00 + 4;
      lVar9 = lVar9 + -1;
    } while (1 < lVar9);
  }
  lVar9 = (long)pbVar3 - (long)s1_00 >> 5;
  if (lVar9 == 1) {
LAB_00147583:
    bVar4 = ci_equal::operator()(&local_532,s1_00,&local_530);
    s1 = pbVar3;
    if (bVar4) {
      s1 = s1_00;
    }
  }
  else {
    s1 = s1_00;
    if (lVar9 == 2) {
LAB_00147564:
      bVar4 = ci_equal::operator()(&local_532,s1,&local_530);
      if (!bVar4) {
        s1_00 = s1 + 1;
        goto LAB_00147583;
      }
    }
    else {
      s1 = pbVar3;
      if ((lVar9 == 3) &&
         (bVar4 = ci_equal::operator()(&local_532,s1_00,&local_530), s1 = s1_00, !bVar4)) {
        s1 = s1_00 + 1;
        goto LAB_00147564;
      }
    }
  }
LAB_0014759e:
  if (s1 == local_4c8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
    local_508 = local_4f8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_508,local_530._M_dataplus._M_p,
               local_530._M_dataplus._M_p + local_530._M_string_length);
    pPVar2 = local_510;
    iVar1 = local_510->m_line_counter;
    local_3f0._0_4_ = 0x2a;
    local_3e8._M_p = local_3d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3e8,local_508,local_500 + (long)local_508);
    local_3c8 = iVar1;
    std::vector<Token<ParsedGame::RulesTokenType>,std::allocator<Token<ParsedGame::RulesTokenType>>>
    ::emplace_back<Token<ParsedGame::RulesTokenType>>
              ((vector<Token<ParsedGame::RulesTokenType>,std::allocator<Token<ParsedGame::RulesTokenType>>>
                *)&(pPVar2->m_parsed_game).rules_tokens,
               (Token<ParsedGame::RulesTokenType> *)local_3f0);
    if (local_3e8._M_p != local_3d8) {
      operator_delete(local_3e8._M_p,local_3d8._0_8_ + 1);
    }
    plVar7 = local_508;
    if (local_508 != local_4f8) goto LAB_001477cc;
  }
  else {
    local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_490,local_530._M_dataplus._M_p,
               local_530._M_dataplus._M_p + local_530._M_string_length);
    pPVar2 = local_510;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParsedGame::RulesTokenType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParsedGame::RulesTokenType>_>,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParsedGame::RulesTokenType>_>_>
    ::_Rb_tree(&local_450,&ParsedGame::to_rules_token_type_abi_cxx11_._M_t);
    iVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParsedGame::RulesTokenType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParsedGame::RulesTokenType>_>,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParsedGame::RulesTokenType>_>_>
            ::find(&local_450,&local_490);
    if ((_Rb_tree_header *)iVar6._M_node == &local_450._M_impl.super__Rb_tree_header) {
      _Var8 = _S_red;
    }
    else {
      _Var8 = iVar6._M_node[2]._M_color;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParsedGame::RulesTokenType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParsedGame::RulesTokenType>_>,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParsedGame::RulesTokenType>_>_>
    ::~_Rb_tree(&local_450);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_490._M_dataplus._M_p != &local_490.field_2) {
      operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
    }
    if (_Var8 == _S_red) {
      local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4b0,local_530._M_dataplus._M_p,
                 local_530._M_dataplus._M_p + local_530._M_string_length);
      detect_error(pPVar2,&local_4b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
        operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
      }
    }
    local_4e8 = local_4d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4e8,"");
    iVar1 = pPVar2->m_line_counter;
    local_3f0._0_4_ = _Var8;
    local_3e8._M_p = local_3d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_3e8,local_4e8,local_4e0 + (long)local_4e8);
    local_3c8 = iVar1;
    std::vector<Token<ParsedGame::RulesTokenType>,std::allocator<Token<ParsedGame::RulesTokenType>>>
    ::emplace_back<Token<ParsedGame::RulesTokenType>>
              ((vector<Token<ParsedGame::RulesTokenType>,std::allocator<Token<ParsedGame::RulesTokenType>>>
                *)&(pPVar2->m_parsed_game).rules_tokens,
               (Token<ParsedGame::RulesTokenType> *)local_3f0);
    if (local_3e8._M_p != local_3d8) {
      operator_delete(local_3e8._M_p,local_3d8._0_8_ + 1);
    }
    local_4f8[0] = local_4d8[0];
    plVar7 = local_4e8;
    if (local_4e8 != local_4d8) {
LAB_001477cc:
      operator_delete(plVar7,local_4f8[0] + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_4c8);
LAB_001477de:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != &local_530.field_2) {
    operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Parser::parse_rules_word()
{
	string parsed_word = parse_word();

	FileSection fs = str_to_enum(parsed_word, to_file_section).value_or(FileSection::None);

	if(fs != FileSection::None)
	{
		try_change_file_section(fs);
	}
	else
	{
		ci_equal comp_equal;

		vector<string> reserved_words = {
			"NO",
			"LATE",
			"AGAIN",
			"MOVING",
			"STATIONARY",
        	"PARALLEL",
        	"PERPENDICULAR",
        	"HORIZONTAL",
        	"VERTICAL",
			"ORTHOGONAL",
			"ACTION",
			"UP",
			"DOWN",
			"LEFT",
			"RIGHT",
			"CHECKPOINT",
			"CANCEL",
			"WIN",
			"MESSAGE",
			"SFX0", "SFX1","SFX2","SFX3","SFX4","SFX5","SFX6","SFX7","SFX8","SFX9","SFX10"};

		auto found_reserved_word = std::find_if(reserved_words.begin(),reserved_words.end(),[&](const string& s){
			return comp_equal(s, parsed_word);
		});

		if(found_reserved_word != reserved_words.end())
		{
			ParsedGame::RulesTokenType token_type = str_to_enum(parsed_word,ParsedGame::to_rules_token_type).value_or(ParsedGame::RulesTokenType::None);
			if(token_type == ParsedGame::RulesTokenType::None)
			{
				//todo more explicit error message
				detect_error(parsed_word);
			}

			m_parsed_game.rules_tokens.push_back(Token<ParsedGame::RulesTokenType>(token_type,"",m_line_counter));
		}
		else
		{
			m_parsed_game.rules_tokens.push_back(Token<ParsedGame::RulesTokenType>(ParsedGame::RulesTokenType::Identifier,parsed_word,m_line_counter));
		}
	}
}